

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> __thiscall
cmGraphVizWriter::CreateTargetFile(cmGraphVizWriter *this,cmLinkItem *item,string *fileNameSuffix)

{
  string *psVar1;
  type pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  cmAlphaNum local_d8;
  cmAlphaNum local_98;
  undefined1 local_68 [8];
  string perTargetFileName;
  string pathSafeItemName;
  string *fileNameSuffix_local;
  cmLinkItem *item_local;
  cmGraphVizWriter *this_local;
  __single_object *perTargetFileStream;
  
  psVar1 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)fileNameSuffix);
  PathSafeString((string *)((long)&perTargetFileName.field_2 + 8),psVar1);
  cmAlphaNum::cmAlphaNum(&local_98,(string *)&item[1].Cross);
  cmAlphaNum::cmAlphaNum(&local_d8,'.');
  cmStrCat<std::__cxx11::string,std::__cxx11::string>
            ((string *)local_68,&local_98,&local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&perTargetFileName.field_2 + 8),in_RCX);
  std::make_unique<cmGeneratedFileStream,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  pcVar2 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                      *)this);
  psVar1 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)fileNameSuffix);
  WriteHeader((cmGraphVizWriter *)item,pcVar2,psVar1);
  pcVar2 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                      *)this);
  WriteNode((cmGraphVizWriter *)item,pcVar2,(cmLinkItem *)fileNameSuffix);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(perTargetFileName.field_2._M_local_buf + 8));
  return (__uniq_ptr_data<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>,_true,_true>
          )(__uniq_ptr_data<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmGeneratedFileStream> cmGraphVizWriter::CreateTargetFile(
  cmLinkItem const& item, std::string const& fileNameSuffix)
{
  auto const pathSafeItemName = PathSafeString(item.AsStr());
  auto const perTargetFileName =
    cmStrCat(this->FileName, '.', pathSafeItemName, fileNameSuffix);
  auto perTargetFileStream =
    cm::make_unique<cmGeneratedFileStream>(perTargetFileName);

  this->WriteHeader(*perTargetFileStream, item.AsStr());
  this->WriteNode(*perTargetFileStream, item);

  return perTargetFileStream;
}